

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall cppcms::impl::garbage_collector::run(garbage_collector *this)

{
  error_code local_40 [3];
  
  local_40[0]._M_value = 0;
  local_40[0]._M_cat = (error_category *)std::_V2::system_category();
  async_run(this,local_40);
  booster::aio::io_service::run();
  return;
}

Assistant:

void run()
	{
		try {
			async_run(booster::system::error_code());
			srv_.run();
		}
		catch(std::exception const &e) {
			BOOSTER_ERROR("cppcms_scale") << "garbage_collector::run: " << 
				e.what() << booster::trace(e);
		}
	}